

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnIfExpr(BinaryReaderInterp *this,Type sig_type)

{
  bool bVar1;
  Result result;
  Offset fixup_offset;
  Offset fixup;
  BinaryReaderInterp *this_local;
  Type sig_type_local;
  
  this_local._0_4_ = sig_type.enum_;
  result = SharedValidator::OnIf
                     (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                      sig_type);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,InterpBrUnless);
    fixup_offset = Istream::EmitFixupU32(this->istream_);
    PushLabel(this,0xffffffff,fixup_offset);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnIfExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnIf(loc, sig_type));
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  PushLabel(Istream::kInvalidOffset, fixup);
  return Result::Ok;
}